

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_entropyCompressSeqStore
                 (seqStore_t *seqStorePtr,ZSTD_entropyCTables_t *prevEntropy,
                 ZSTD_entropyCTables_t *nextEntropy,ZSTD_CCtx_params *cctxParams,void *dst,
                 size_t dstCapacity,size_t srcSize,void *entropyWorkspace,size_t entropyWkspSize,
                 int bmi2)

{
  ZSTD_fseCTables_t *nextEntropy_00;
  ZSTD_strategy ZVar1;
  uint uVar2;
  seqDef *sequences;
  seqDef *psVar3;
  BYTE *ofCodeTable;
  BYTE *llCodeTable;
  BYTE *mlCodeTable;
  size_t err_code;
  size_t sVar4;
  byte *pbVar5;
  byte bVar6;
  uint disableLiteralCompression;
  ulong nbSeq;
  ZSTD_symbolEncodingTypeStats_t local_50;
  
  ZVar1 = (cctxParams->cParams).strategy;
  uVar2 = (cctxParams->cParams).windowLog;
  disableLiteralCompression = 0;
  if (cctxParams->literalCompressionMode != ZSTD_lcm_huffman) {
    if (cctxParams->literalCompressionMode == ZSTD_lcm_uncompressed) {
      disableLiteralCompression = 1;
    }
    else if (ZVar1 == ZSTD_fast) {
      disableLiteralCompression = (uint)((cctxParams->cParams).targetLength != 0);
    }
  }
  sequences = seqStorePtr->sequencesStart;
  psVar3 = seqStorePtr->sequences;
  ofCodeTable = seqStorePtr->ofCode;
  llCodeTable = seqStorePtr->llCode;
  mlCodeTable = seqStorePtr->mlCode;
  sVar4 = ZSTD_compressLiterals
                    (&prevEntropy->huf,&nextEntropy->huf,ZVar1,disableLiteralCompression,dst,
                     dstCapacity,seqStorePtr->litStart,
                     (long)seqStorePtr->lit - (long)seqStorePtr->litStart,
                     (void *)((long)entropyWorkspace + 0xd4),0x1904,(int)entropyWkspSize);
  if (0xffffffffffffff88 < sVar4) goto LAB_001bab20;
  if ((long)(dstCapacity - sVar4) < 4) {
    if (srcSize <= dstCapacity) {
      return 0;
    }
    return 0xffffffffffffffba;
  }
  nbSeq = (long)psVar3 - (long)sequences >> 3;
  pbVar5 = (byte *)(sVar4 + (long)dst);
  if (nbSeq < 0x80) {
    *pbVar5 = (byte)nbSeq;
    pbVar5 = pbVar5 + 1;
  }
  else if (nbSeq < 0x7f00) {
    *pbVar5 = (byte)(nbSeq >> 8) | 0x80;
    pbVar5[1] = (byte)nbSeq;
    pbVar5 = pbVar5 + 2;
  }
  else {
    *pbVar5 = 0xff;
    *(short *)(pbVar5 + 1) = (short)nbSeq + -0x7f00;
    pbVar5 = pbVar5 + 3;
  }
  nextEntropy_00 = &nextEntropy->fse;
  if (psVar3 == sequences) {
    memcpy(nextEntropy_00,&prevEntropy->fse,0xde0);
  }
  else {
    ZSTD_buildSequencesStatistics
              (&local_50,seqStorePtr,nbSeq,&prevEntropy->fse,nextEntropy_00,pbVar5 + 1,
               (BYTE *)((long)dst + dstCapacity),ZVar1,(uint *)entropyWorkspace,
               (void *)((long)entropyWorkspace + 0xd4),0x1904);
    sVar4 = local_50.size;
    if (0xffffffffffffff88 < local_50.size) goto LAB_001bab20;
    *pbVar5 = (char)(local_50.Offtype << 4) + (char)(local_50.LLtype << 6) +
              (char)local_50.MLtype * '\x04';
    pbVar5 = pbVar5 + 1 + local_50.size;
    sVar4 = ZSTD_encodeSequences
                      (pbVar5,(long)((long)dst + dstCapacity) - (long)pbVar5,
                       (nextEntropy->fse).matchlengthCTable,mlCodeTable,
                       nextEntropy_00->offcodeCTable,ofCodeTable,(nextEntropy->fse).litlengthCTable,
                       llCodeTable,sequences,nbSeq,(uint)(0x39 < uVar2),(int)entropyWkspSize);
    if (0xffffffffffffff88 < sVar4) goto LAB_001bab20;
    if ((local_50.lastCountSize != 0) && (local_50.lastCountSize + sVar4 < 4)) {
      return 0;
    }
    pbVar5 = pbVar5 + sVar4;
  }
  sVar4 = (long)pbVar5 - (long)dst;
  if ((long)pbVar5 - (long)dst == 0) {
    return 0;
  }
LAB_001bab20:
  if ((srcSize <= dstCapacity) && (sVar4 == 0xffffffffffffffba)) {
    return 0;
  }
  if (0xffffffffffffff88 < sVar4) {
    return sVar4;
  }
  ZVar1 = (cctxParams->cParams).strategy;
  bVar6 = 6;
  if (ZSTD_btopt < ZVar1) {
    bVar6 = (char)ZVar1 - 1;
  }
  if ((srcSize - (srcSize >> (bVar6 & 0x3f))) - 2 <= sVar4) {
    return 0;
  }
  return sVar4;
}

Assistant:

MEM_STATIC size_t
ZSTD_entropyCompressSeqStore(seqStore_t* seqStorePtr,
                       const ZSTD_entropyCTables_t* prevEntropy,
                             ZSTD_entropyCTables_t* nextEntropy,
                       const ZSTD_CCtx_params* cctxParams,
                             void* dst, size_t dstCapacity,
                             size_t srcSize,
                             void* entropyWorkspace, size_t entropyWkspSize,
                             int bmi2)
{
    size_t const cSize = ZSTD_entropyCompressSeqStore_internal(
                            seqStorePtr, prevEntropy, nextEntropy, cctxParams,
                            dst, dstCapacity,
                            entropyWorkspace, entropyWkspSize, bmi2);
    if (cSize == 0) return 0;
    /* When srcSize <= dstCapacity, there is enough space to write a raw uncompressed block.
     * Since we ran out of space, block must be not compressible, so fall back to raw uncompressed block.
     */
    if ((cSize == ERROR(dstSize_tooSmall)) & (srcSize <= dstCapacity))
        return 0;  /* block not compressed */
    FORWARD_IF_ERROR(cSize, "ZSTD_entropyCompressSeqStore_internal failed");

    /* Check compressibility */
    {   size_t const maxCSize = srcSize - ZSTD_minGain(srcSize, cctxParams->cParams.strategy);
        if (cSize >= maxCSize) return 0;  /* block not compressed */
    }
    DEBUGLOG(4, "ZSTD_entropyCompressSeqStore() cSize: %zu", cSize);
    return cSize;
}